

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

SurfaceMesh * __thiscall polyscope::SurfaceMesh::setEdgeColor(SurfaceMesh *this,vec3 val)

{
  undefined8 uVar1;
  SurfaceMesh *in_RDI;
  undefined1 in_XMM0 [16];
  undefined4 in_XMM1_Da;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar1 = vmovlpd_avx(in_XMM0);
  PersistentValue<glm::vec<3,float,(glm::qualifier)0>>::operator=
            ((PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *)
             CONCAT44((int)uVar1,in_stack_fffffffffffffff0),
             (vec<3,_float,_(glm::qualifier)0> *)CONCAT44(in_XMM1_Da,(int)((ulong)uVar1 >> 0x20)));
  requestRedraw();
  return in_RDI;
}

Assistant:

SurfaceMesh* SurfaceMesh::setEdgeColor(glm::vec3 val) {
  edgeColor = val;
  requestRedraw();
  return this;
}